

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Testrunner.cpp
# Opt level: O2

void runSingleTest(Setup *s,u16 op)

{
  Setup *pSVar1;
  Result mor;
  Result mur;
  Result local_450;
  Result local_238;
  
  opcode = op;
  setupTestInstruction(s,0x1000,op);
  Sandbox::prepare(&sandbox,op);
  resetMusashi(s);
  pSVar1 = s;
  resetMoira(s);
  runBinutils(pSVar1,&local_238);
  pSVar1 = s;
  runMusashi(s,&local_238);
  muclk[0] = local_238.elapsed[0] + muclk[0];
  muclk[1] = local_238.elapsed[1] + muclk[1];
  runMoira(pSVar1,&local_450);
  moclk[0] = local_450.elapsed[0] + moclk[0];
  moclk[1] = local_450.elapsed[1] + moclk[1];
  compare(s,&local_238,&local_450);
  return;
}

Assistant:

void runSingleTest(Setup &s, u16 op)
{
    Result mur, mor;

    opcode = op;

    // Prepare the test case with the selected instruction
    setupTestInstruction(s, pc, op);

    // Reset the sandbox (memory accesses observer)
    sandbox.prepare(op);

    // Prepare
    resetMusashi(s);
    resetMoira(s);

    // Run the binutils disassembler
    runBinutils(s, mur);

    // Run Musashi
    runMusashi(s, mur);
    muclk[0] += mur.elapsed[0];
    muclk[1] += mur.elapsed[1];

    // Run Moira
    runMoira(s, mor);
    moclk[0] += mor.elapsed[0];
    moclk[1] += mor.elapsed[1];

    // Compare
    compare(s, mur, mor);
}